

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void clearbykeys(global_State *g,GCObject *l)

{
  int iVar1;
  Table *h;
  GCObject *o;
  ulong uVar2;
  ulong uVar3;
  
  do {
    if (l == (GCObject *)0x0) {
      return;
    }
    uVar3 = *(ulong *)&l[1].tt;
    uVar2 = (long)(1 << (l->field_0xb & 0x1f)) * 0x18 + uVar3;
    for (; uVar3 < uVar2; uVar3 = uVar3 + 0x18) {
      if ((*(byte *)(uVar3 + 9) & 0x40) == 0) {
        o = (GCObject *)0x0;
      }
      else {
        o = *(GCObject **)(uVar3 + 0x10);
      }
      iVar1 = iscleared(g,o);
      if (iVar1 == 0) {
        if ((*(byte *)(uVar3 + 8) & 0xf) == 0) goto LAB_0013d5d9;
      }
      else {
        *(undefined1 *)(uVar3 + 8) = 0x10;
LAB_0013d5d9:
        if ((*(byte *)(uVar3 + 9) & 0x40) != 0) {
          *(undefined1 *)(uVar3 + 9) = 0xb;
        }
      }
    }
    l = l[3].next;
  } while( true );
}

Assistant:

static void clearbykeys (global_State *g, GCObject *l) {
  for (; l; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *limit = gnodelast(h);
    Node *n;
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gckeyN(n)))  /* unmarked key? */
        setempty(gval(n));  /* remove entry */
      if (isempty(gval(n)))  /* is entry empty? */
        clearkey(n);  /* clear its key */
    }
  }
}